

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcircuit.cpp
# Opt level: O3

bool __thiscall
SubCircuit<4>::exploreSubtree
          (SubCircuit<4> *this,int thisNode,int startPrevSubtree,int endPrevSubtree,int *backfrom,
          int *backto,int *numback)

{
  int *piVar1;
  IntVar *pIVar2;
  bool bVar3;
  Lit LVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Clause *pCVar8;
  ulong uVar9;
  undefined1 auVar10 [8];
  vec<int> *pvVar11;
  IntView<4> *pIVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  Clause *c;
  int local_1ac;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  bool local_198;
  int local_190;
  int local_18c;
  vec<int> local_188;
  Clause *local_178;
  int *piStack_170;
  uint local_160;
  int local_15c;
  int **local_158;
  IntView<4> *local_150;
  Clause *local_148;
  int *local_140;
  int *local_138;
  vec<SubCircuit<4>::PROP> *local_130;
  vec<int> local_128;
  vec<int> local_118;
  vec<int> local_108;
  vec<int> local_f8;
  vec<int> local_e8;
  vec<int> local_d8;
  vec<int> local_c8;
  vec<int> local_b8;
  vec<int> local_a8;
  vec<int> local_98;
  vec<int> local_88;
  vec<int> local_78;
  vec<int> local_68;
  vec<int> local_58;
  int **local_48;
  IntVar *local_40;
  long local_38;
  
  iVar15 = this->nodesSeen;
  this->nodesSeen = iVar15 + 1;
  this->index[thisNode] = iVar15;
  this->lowlink[thisNode] = iVar15;
  local_40 = this->x[thisNode].var;
  iVar15 = (local_40->min).v;
  pIVar12 = this->x + thisNode;
  local_48 = &local_c8.data;
  local_130 = &this->propQueue;
  local_158 = &local_88.data;
  local_18c = (int)CONCAT71((int7)((ulong)local_158 >> 8),1);
  local_1ac = thisNode;
  local_190 = endPrevSubtree;
  local_15c = startPrevSubtree;
  local_150 = pIVar12;
  local_138 = backfrom;
  do {
    local_38 = (long)iVar15;
    lVar17 = pIVar12->b + local_38;
    piVar1 = this->index;
    iVar6 = piVar1[lVar17];
    iVar7 = (int)lVar17;
    if (iVar6 == -1) {
      bVar3 = exploreSubtree(this,iVar7,local_15c,endPrevSubtree,backfrom,backto,numback);
      if (!bVar3) {
        return false;
      }
      piVar1 = this->lowlink;
      if (piVar1[lVar17] < piVar1[local_1ac]) {
        piVar1[local_1ac] = piVar1[lVar17];
      }
      pIVar12 = local_150;
      if (((byte)local_18c & this->pruneWithin) == 1) {
        local_18c = 0;
        if (piVar1[lVar17] == this->index[local_1ac]) {
          local_178 = (Clause *)0x0;
          piStack_170 = (int *)0x0;
          local_188.sz = 0;
          local_188.cap = 0;
          local_188.data = (int *)0x0;
          local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
          uVar13 = 0;
          if (0 < *(int *)&(this->super_Propagator).field_0x14) {
            iVar6 = 0;
            do {
              piVar1 = this->index;
              pvVar11 = (vec<int> *)&local_178;
              if ((piVar1[lVar17] <= piVar1[iVar6]) ||
                 (pvVar11 = &local_188, piVar1[iVar6] != piVar1[local_1ac])) {
                vec<int>::push(pvVar11,(int *)local_1a8);
              }
              iVar6 = local_1a8._0_4_ + 1;
              local_1a8._0_4_ = iVar6;
            } while (iVar6 < *(int *)&(this->super_Propagator).field_0x14);
            uVar13 = (uint)local_178;
          }
          local_68.sz = uVar13;
          local_68.cap = uVar13;
          local_68.data = (int *)malloc((ulong)uVar13 * 4);
          if (uVar13 != 0) {
            uVar16 = 0;
            do {
              local_68.data[uVar16] = piStack_170[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar13 != uVar16);
          }
          local_18c = (int)getEvidenceLit(this,&local_68);
          endPrevSubtree = local_190;
          if (local_68.data != (int *)0x0) {
            free(local_68.data);
          }
          local_68.data = (int *)0x0;
          uVar16 = local_188._0_8_ & 0xffffffff;
          local_78.sz = local_188.sz;
          local_78.cap = local_188.sz;
          local_78.data = (int *)malloc(uVar16 * 4);
          if (uVar16 != 0) {
            uVar9 = 0;
            do {
              local_78.data[uVar9] = local_188.data[uVar9];
              uVar9 = uVar9 + 1;
            } while (uVar16 != uVar9);
          }
          LVar4 = getEvidenceLit(this,&local_78);
          if (local_78.data != (int *)0x0) {
            free(local_78.data);
          }
          local_78.data = (int *)0x0;
          if (LVar4.x != 1) {
            if (so.lazy == true) {
              iVar6 = local_188.sz * (uint)local_178 + 2;
              local_140 = backto;
              local_1a8 = (undefined1  [8])malloc((long)iVar6 * 4 + 8);
              *(uint *)local_1a8 = iVar6 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_1a8);
              auVar10 = local_1a8;
              if (*(uint *)local_1a8 < 0x200) goto LAB_00147a85;
              *(int *)((long)local_1a8 + 8) = LVar4.x;
              uVar16 = (ulong)local_178 & 0xffffffff;
              local_88.sz = (uint)local_178;
              local_88.cap = (uint)local_178;
              local_88.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar9 = 0;
                do {
                  local_88.data[uVar9] = piStack_170[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
              uVar16 = local_188._0_8_ & 0xffffffff;
              local_98.sz = local_188.sz;
              local_98.cap = local_188.sz;
              local_98.data = (int *)malloc(uVar16 * 4);
              backto = local_140;
              if (uVar16 != 0) {
                uVar9 = 0;
                do {
                  local_98.data[uVar9] = local_188.data[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
              explainAcantreachB(this,(Clause *)auVar10,2,&local_88,&local_98,-1,-1);
              if (local_98.data != (int *)0x0) {
                free(local_98.data);
              }
              local_98.data = (int *)0x0;
              if (local_88.data != (int *)0x0) {
                free(local_88.data);
              }
              local_88.data = (int *)0x0;
            }
            else {
              auVar10 = (undefined1  [8])0x0;
            }
            uStack_1a0 = (int *)CONCAT44(iVar7,local_1ac);
            local_198 = false;
            local_1a8 = auVar10;
            vec<SubCircuit<4>::PROP>::push(local_130,(PROP *)local_1a8);
            endPrevSubtree = local_190;
          }
          iVar6 = local_18c;
          if (local_18c != 1) {
            if (so.lazy == true) {
              iVar7 = local_188.sz * (uint)local_178 + 2;
              local_1a8 = (undefined1  [8])malloc((long)iVar7 * 4 + 8);
              *(uint *)local_1a8 = iVar7 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_1a8);
              auVar10 = local_1a8;
              if (*(uint *)local_1a8 < 0x200) goto LAB_00147a85;
              *(int *)((long)local_1a8 + 8) = iVar6;
              uVar16 = (ulong)local_178 & 0xffffffff;
              local_a8.sz = (uint)local_178;
              local_a8.cap = (uint)local_178;
              local_a8.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar9 = 0;
                do {
                  local_a8.data[uVar9] = piStack_170[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
              uVar16 = local_188._0_8_ & 0xffffffff;
              local_b8.sz = local_188.sz;
              local_b8.cap = local_188.sz;
              local_b8.data = (int *)malloc(uVar16 * 4);
              if (uVar16 != 0) {
                uVar9 = 0;
                do {
                  local_b8.data[uVar9] = local_188.data[uVar9];
                  uVar9 = uVar9 + 1;
                } while (uVar16 != uVar9);
              }
              explainAcantreachB(this,(Clause *)auVar10,2,&local_a8,&local_b8,-1,-1);
              endPrevSubtree = local_190;
              if (local_b8.data != (int *)0x0) {
                free(local_b8.data);
              }
              local_b8.data = (int *)0x0;
              if (local_a8.data != (int *)0x0) {
                free(local_a8.data);
              }
              local_a8.data = (int *)0x0;
            }
            else {
              auVar10 = (undefined1  [8])0x0;
            }
            if (local_188.sz != 0) {
              uVar16 = 0;
              uVar13 = local_188.sz;
              do {
                iVar6 = local_188.data[uVar16];
                lVar17 = (long)local_1ac - (long)this->x[iVar6].b;
                pIVar2 = this->x[iVar6].var;
                if ((((pIVar2->min).v <= lVar17) && (lVar17 <= (pIVar2->max).v)) &&
                   ((pIVar2->vals == (Tchar *)0x0 || (pIVar2->vals[lVar17].v != '\0')))) {
                  uStack_1a0 = (int *)CONCAT44(local_1ac,iVar6);
                  local_198 = false;
                  local_1a8 = auVar10;
                  vec<SubCircuit<4>::PROP>::push(local_130,(PROP *)local_1a8);
                  uVar13 = local_188.sz;
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 < uVar13);
            }
          }
          if (local_188.data != (int *)0x0) {
            free(local_188.data);
          }
          backfrom = local_138;
          if (piStack_170 != (int *)0x0) {
            free(piStack_170);
          }
          local_18c = 0;
          pIVar12 = local_150;
        }
      }
      else {
        local_18c = 0;
      }
    }
    else if (iVar7 != local_1ac) {
      if (iVar6 <= endPrevSubtree && local_15c <= iVar6) {
        *numback = *numback + 1;
        *backfrom = local_1ac;
        *backto = iVar7;
      }
      if ((this->pruneSkip == true) && (piVar1[lVar17] < local_15c)) {
        local_58.sz = (this->prev).sz;
        uVar16 = (ulong)local_58.sz;
        local_58.cap = local_58.sz;
        local_58.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          piVar1 = (this->prev).data;
          uVar9 = 0;
          do {
            local_58.data[uVar9] = piVar1[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
        }
        LVar4 = getEvidenceLit(this,&local_58);
        if (local_58.data != (int *)0x0) {
          free(local_58.data);
        }
        local_58.data = (int *)0x0;
        pIVar12 = local_150;
        endPrevSubtree = local_190;
        if (LVar4.x != 1) {
          if (so.lazy == true) {
            local_1a8 = (undefined1  [8])0x0;
            uStack_1a0 = (int *)0x0;
            local_160 = (uint)LVar4;
            local_140 = backto;
            vec<int>::reserve((vec<int> *)local_1a8,(this->later).sz + (this->prev).sz);
            uVar13 = 0;
            uVar5 = 0;
            if ((this->prev).sz != 0) {
              lVar14 = 0;
              uVar16 = 0;
              do {
                vec<int>::push((vec<int> *)local_1a8,(int *)((long)(this->prev).data + lVar14));
                uVar16 = uVar16 + 1;
                uVar5 = (this->prev).sz;
                lVar14 = lVar14 + 4;
                backfrom = local_138;
              } while (uVar16 < uVar5);
            }
            if ((this->later).sz != 0) {
              lVar14 = 0;
              uVar16 = 0;
              do {
                vec<int>::push((vec<int> *)local_1a8,(int *)((long)(this->later).data + lVar14));
                uVar16 = uVar16 + 1;
                uVar13 = (this->later).sz;
                lVar14 = lVar14 + 4;
              } while (uVar16 < uVar13);
              uVar5 = (this->prev).sz;
              backfrom = local_138;
            }
            iVar6 = uVar5 * uVar13 + local_1a8._0_4_ * (this->earlier).sz + 2;
            local_178 = (Clause *)malloc((long)iVar6 * 4 + 8);
            *(uint *)local_178 = iVar6 * 0x100 | 2;
            vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_178);
            if (*(uint *)local_178 < 0x200) goto LAB_00147a85;
            local_148 = local_178;
            *(uint *)(local_178 + 1) = local_160;
            local_c8.sz = (this->prev).sz;
            uVar16 = (ulong)local_c8.sz;
            local_c8.cap = local_c8.sz;
            local_c8.data = (int *)malloc(uVar16 * 4);
            if (uVar16 != 0) {
              piVar1 = (this->prev).data;
              uVar9 = 0;
              do {
                local_c8.data[uVar9] = piVar1[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            local_d8.sz = (this->later).sz;
            uVar16 = (ulong)local_d8.sz;
            local_d8.cap = local_d8.sz;
            local_d8.data = (int *)malloc(uVar16 * 4);
            backto = local_140;
            if (uVar16 != 0) {
              piVar1 = (this->later).data;
              uVar9 = 0;
              do {
                local_d8.data[uVar9] = piVar1[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            explainAcantreachB(this,local_148,2,&local_c8,&local_d8,-1,-1);
            if (local_d8.data != (int *)0x0) {
              free(local_d8.data);
            }
            local_d8.data = (int *)0x0;
            if (local_c8.data != (int *)0x0) {
              free(local_c8.data);
            }
            local_c8.data = (int *)0x0;
            local_160 = (this->later).sz * (this->prev).sz;
            local_e8.sz = (this->earlier).sz;
            uVar16 = (ulong)local_e8.sz;
            local_e8.cap = local_e8.sz;
            local_e8.data = (int *)malloc(uVar16 * 4);
            if (uVar16 != 0) {
              piVar1 = (this->earlier).data;
              uVar9 = 0;
              do {
                local_e8.data[uVar9] = piVar1[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            uVar16 = (ulong)local_1a8 & 0xffffffff;
            local_f8.sz = local_1a8._0_4_;
            local_f8.cap = local_1a8._0_4_;
            local_f8.data = (int *)malloc(uVar16 * 4);
            if (uVar16 != 0) {
              uVar9 = 0;
              do {
                local_f8.data[uVar9] = uStack_1a0[uVar9];
                uVar9 = uVar9 + 1;
              } while (uVar16 != uVar9);
            }
            explainAcantreachB(this,local_148,local_160 + 2,&local_e8,&local_f8,-1,-1);
            endPrevSubtree = local_190;
            if (local_f8.data != (int *)0x0) {
              free(local_f8.data);
            }
            local_f8.data = (int *)0x0;
            if (local_e8.data != (int *)0x0) {
              free(local_e8.data);
            }
            local_e8.data = (int *)0x0;
            pCVar8 = local_148;
            if (uStack_1a0 != (int *)0x0) {
              free(uStack_1a0);
              pCVar8 = local_148;
            }
          }
          else {
            pCVar8 = (Clause *)0x0;
          }
          uStack_1a0 = (int *)CONCAT44(iVar7,local_1ac);
          local_198 = false;
          local_1a8 = (undefined1  [8])pCVar8;
          vec<SubCircuit<4>::PROP>::push(local_130,(PROP *)local_1a8);
          pIVar12 = local_150;
        }
      }
      if (this->index[lVar17] < this->lowlink[local_1ac]) {
        this->lowlink[local_1ac] = this->index[lVar17];
      }
    }
    if (iVar15 == (local_40->max).v) break;
    lVar17 = 0;
    do {
      lVar14 = lVar17 + local_38 + 1;
      lVar17 = lVar17 + 1;
    } while (local_40->vals[lVar14].v == '\0');
    iVar15 = iVar15 + (int)lVar17;
  } while (-0x80000000 - local_38 != lVar17);
  if (this->lowlink[local_1ac] == this->index[local_1ac]) {
    local_178 = (Clause *)0x0;
    piStack_170 = (int *)0x0;
    local_188.sz = 0;
    local_188.cap = 0;
    local_188.data = (int *)0x0;
    local_1a8 = (undefined1  [8])((ulong)local_1a8 & 0xffffffff00000000);
    if (*(int *)&(this->super_Propagator).field_0x14 < 1) {
      uVar13 = 0;
    }
    else {
      iVar15 = 0;
      do {
        pvVar11 = (vec<int> *)&local_178;
        if ((this->index[local_1ac] < this->index[iVar15]) ||
           (pvVar11 = &local_188, iVar15 != local_1ac)) {
          vec<int>::push(pvVar11,(int *)local_1a8);
        }
        iVar15 = local_1a8._0_4_ + 1;
        local_1a8._0_4_ = iVar15;
      } while (iVar15 < *(int *)&(this->super_Propagator).field_0x14);
      uVar13 = (uint)local_178;
    }
    local_108.sz = uVar13;
    local_108.cap = uVar13;
    local_108.data = (int *)malloc((ulong)uVar13 * 4);
    if (uVar13 != 0) {
      uVar16 = 0;
      do {
        local_108.data[uVar16] = piStack_170[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar13 != uVar16);
    }
    LVar4 = getEvidenceLit(this,&local_108);
    if (local_108.data != (int *)0x0) {
      free(local_108.data);
    }
    local_108.data = (int *)0x0;
    vec<int>::push((vec<int> *)&local_178,&local_1ac);
    if (LVar4.x != 1) {
      if (so.lazy == true) {
        iVar15 = local_188.sz * (uint)local_178 + 2;
        local_1a8 = (undefined1  [8])malloc((long)iVar15 * 4 + 8);
        *(uint *)local_1a8 = iVar15 * 0x100 | 2;
        vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)local_1a8);
        auVar10 = local_1a8;
        if (*(uint *)local_1a8 < 0x200) {
LAB_00147a85:
          abort();
        }
        *(int *)((long)local_1a8 + 8) = LVar4.x;
        uVar16 = (ulong)local_178 & 0xffffffff;
        local_118.sz = (uint)local_178;
        local_118.cap = (uint)local_178;
        local_118.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar9 = 0;
          do {
            local_118.data[uVar9] = piStack_170[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
        }
        uVar16 = local_188._0_8_ & 0xffffffff;
        local_128.sz = local_188.sz;
        local_128.cap = local_188.sz;
        local_128.data = (int *)malloc(uVar16 * 4);
        if (uVar16 != 0) {
          uVar9 = 0;
          do {
            local_128.data[uVar9] = local_188.data[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar16 != uVar9);
        }
        explainAcantreachB(this,(Clause *)auVar10,2,&local_118,&local_128,-1,-1);
        if (local_128.data != (int *)0x0) {
          free(local_128.data);
        }
        local_128.data = (int *)0x0;
        if (local_118.data != (int *)0x0) {
          free(local_118.data);
        }
        local_118.data = (int *)0x0;
      }
      else {
        auVar10 = (undefined1  [8])0x0;
      }
      if (local_188.sz != 0) {
        uVar16 = 0;
        uVar13 = local_188.sz;
        do {
          iVar15 = local_188.data[uVar16];
          lVar17 = (long)iVar15;
          pIVar2 = this->x[lVar17].var;
          iVar6 = (pIVar2->min).v;
          if ((iVar6 != (pIVar2->max).v) || ((long)this->x[lVar17].b + (long)iVar6 != lVar17)) {
            uStack_1a0 = (int *)CONCAT44(iVar15,iVar15);
            local_198 = true;
            local_1a8 = auVar10;
            vec<SubCircuit<4>::PROP>::push(&this->propQueue,(PROP *)local_1a8);
            uVar13 = local_188.sz;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 < uVar13);
      }
    }
    if (local_188.data != (int *)0x0) {
      free(local_188.data);
    }
    if (piStack_170 != (int *)0x0) {
      free(piStack_170);
    }
  }
  return true;
}

Assistant:

bool exploreSubtree(int thisNode, int startPrevSubtree, int endPrevSubtree, int* backfrom,
											int* backto, int* numback) {
		// fprintf(stderr,"exploring subtree\n");
		index[thisNode] = nodesSeen++;
		lowlink[thisNode] = index[thisNode];
		bool isFirstChild = true;
		int child;
		for (typename IntView<U>::iterator i = x[thisNode].begin(); i != x[thisNode].end(); ++i) {
			child = *i;
			// If we haven't visited the child yet, do so now
			if (index[child] == -1) {
				// fprintf(stderr,"new child %d\n", child);
				if (!exploreSubtree(child, startPrevSubtree, endPrevSubtree, backfrom, backto, numback)) {
					return false;  // fail if there was an scc contained within this child
				}

				if (lowlink[child] < lowlink[thisNode]) {
					lowlink[thisNode] = lowlink[child];
				}

				// If this is the first child and its lowlink is equal to the
				// parent's index, we can prune the edge from this node to the
				// child (as the circuit must come back up through an edge from
				// the child to this node and therefore can't go in the other
				// direction). We can do this as long as there is a node outside
				// the child and this node which has to be in.
				// We can also prune any edges from a node outside the child's
				// subtree to this node, as long as something inside the child has to be in.
				if (pruneWithin && isFirstChild && lowlink[child] == index[thisNode]) {
					// XXX [AS] Commented following line, because propagator related statistics
					// should be collected within the propagator class.
					// engine.prunedGeneralise++;
					// The reason is that no node in the child's subtree reaches a node outside the subtree
					// that isn't the parent, and at least one node in the child's subtree is in the circuit
					// First divide the nodes into those inside and outside the child's subtree
					vec<int> inside;
					vec<int> outside;
					for (int i = 0; i < size; i++) {
						if (index[i] >= index[child]) {
							inside.push(i);
						} else if (index[i] != index[thisNode]) {
							outside.push(i);
						}
					}

					// Now check one node is definitely in
					const Lit evidenceIn = getEvidenceLit(inside);
					const Lit evidenceOut = getEvidenceLit(outside);
					if (evidenceOut != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceOut;
							explainAcantreachB(r, 2, inside, outside);
						}
						addPropagation(false, thisNode, child, r);
					}
					if (evidenceIn != lit_True) {
						Clause* r = nullptr;
						if (so.lazy) {
							r = Reason_new(inside.size() * outside.size() + 2);
							(*r)[1] = evidenceIn;
							explainAcantreachB(r, 2, inside, outside);
						}
						for (unsigned int i = 0; i < outside.size(); i++) {
							if (x[outside[i]].indomain(thisNode)) {
								addPropagation(false, outside[i], thisNode, r);
							}
						}
					}
				}

				isFirstChild = false;        // We've now visited at least one child
			} else if (child != thisNode)  // This is a node we've seen before (ignore self-cycle edges)
			{
				// fprintf(stderr,"old child %d\n", child);
				//  If child is within the last subtree we've found a backedge (from this node to the child)
				if (index[child] >= startPrevSubtree && index[child] <= endPrevSubtree) {
					(*numback)++;
					*backfrom = thisNode;
					*backto = child;
				}

				// If w is from a subtree before the previous one prune this edge (if that option is set)
				if (pruneSkip && index[child] < startPrevSubtree) {
					const Lit evidence = getEvidenceLit(prev);
					if (evidence != lit_True) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.prunedSkip++;
						Clause* r = nullptr;
						if (so.lazy) {
							// The reason is that no node in an earlier
							// subtree can reach the prev or later subtrees,
							// and no node in the prev subtree can reach
							// later subtrees.
							vec<int> prevAndLater;
							prevAndLater.reserve(prev.size() + later.size());
							for (unsigned int i = 0; i < prev.size(); i++) {
								prevAndLater.push(prev[i]);
							}
							for (unsigned int i = 0; i < later.size(); i++) {
								prevAndLater.push(later[i]);
							}
							r = Reason_new(earlier.size() * prevAndLater.size() + prev.size() * later.size() + 2);
							(*r)[1] = evidence;
							explainAcantreachB(r, 2, prev, later);
							explainAcantreachB(r, prev.size() * later.size() + 2, earlier, prevAndLater);
						}
						addPropagation(false, thisNode, child, r);
					}
				}

				if (index[child] < lowlink[thisNode]) {
					lowlink[thisNode] = index[child];
				}
			}
			// fprintf(stderr,"lowpoint is %d\n", lowlink[thisNode]);
		}

		// Fail if there's an scc rooted here
		if (lowlink[thisNode] == index[thisNode]) {
			// The reason is that no node in the subtree rooted by this
			// one (including this one)
			// reaches a node outside that subtree, and some node inside
			// the subtree (not including this node) is required in the circuit.
			// Start by finding the nodes inside and outside the subtree.
			vec<int> inside;
			vec<int> outside;

			for (int i = 0; i < size; i++) {
				if (index[i] > index[thisNode]) {
					inside.push(i);
				} else if (i != thisNode) {
					outside.push(i);
				}
			}

			const Lit evidenceInside = getEvidenceLit(inside);  // at this point inside excludes this node

			inside.push(thisNode);  // now include this node

			// Set all vars outside the component to be self-cycles
			if (evidenceInside != lit_True) {
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(inside.size() * outside.size() + 2);
					(*r)[1] = evidenceInside;

					explainAcantreachB(r, 2, inside, outside);
				}
				for (unsigned int i = 0; i < outside.size(); i++) {
					const int varOutside = outside[i];
					if (x[varOutside].setValNotR(varOutside)) {
						// XXX [AS] Commented following line, because propagator related statistics
						// should be collected within the propagator class.
						// engine.multipleSCC++;
						addPropagation(true, varOutside, varOutside, r);
						/* if(!x[varOutside].setVal(varOutside, r))
						 {
						 fprintf(stderr, "failing\n");
								 return false;
						 }*/
					}
				}
			}
		}

		return true;
	}